

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

void __thiscall
pbrt::PerspectiveCamera::PDF_We(PerspectiveCamera *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  bool bVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar12 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  float n2;
  undefined1 auVar13 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar19 [60];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar14 [16];
  undefined1 auVar17 [64];
  undefined1 auVar20 [56];
  undefined1 auVar18 [64];
  float fVar21;
  undefined1 auVar22 [16];
  Bounds2f BVar23;
  Vector3f VVar24;
  Point3f PVar25;
  int local_50;
  float va;
  Tuple3<pbrt::Vector3,_float> local_48;
  undefined1 local_38 [16];
  
  auVar19 = in_ZMM1._4_60_;
  local_48.x = 0.0;
  local_48.y = 0.0;
  local_48.z = 1.0;
  auVar12 = (undefined1  [56])0x0;
  VVar24 = AnimatedTransform::operator()((AnimatedTransform *)this,(Vector3f *)&local_48,ray->time);
  auVar15._0_4_ = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar15._4_60_ = auVar19;
  auVar17._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar17._8_56_ = auVar12;
  auVar6 = vmovshdup_avx(auVar17._0_16_);
  auVar7 = ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.x);
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ *
                                         (ray->d).super_Tuple3<pbrt::Vector3,_float>.y)),auVar7,
                           auVar17._0_16_);
  auVar6 = vfmadd231ss_fma(auVar6,auVar15._0_16_,
                           ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.z));
  fVar21 = auVar6._0_4_;
  if (this->cosTotalWidth < fVar21) {
    auVar6._0_12_ = ZEXT812(0);
    auVar6._12_4_ = 0;
    uVar3 = vcmpss_avx512f(auVar6,ZEXT416((uint)(this->super_ProjectiveCamera).lensRadius),1);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar5 = (float)((uint)bVar4 * (int)(this->super_ProjectiveCamera).focalDistance +
                   (uint)!bVar4 * 0x3f800000) / fVar21;
    auVar6 = vinsertps_avx(auVar7,ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.y),0x10)
    ;
    uVar1 = (ray->o).super_Tuple3<pbrt::Point3,_float>.x;
    uVar2 = (ray->o).super_Tuple3<pbrt::Point3,_float>.y;
    auVar7._0_4_ = auVar6._0_4_ * fVar5 + (float)uVar1;
    auVar7._4_4_ = auVar6._4_4_ * fVar5 + (float)uVar2;
    auVar7._8_4_ = auVar6._8_4_ * fVar5 + 0.0;
    auVar7._12_4_ = auVar6._12_4_ * fVar5 + 0.0;
    local_48.z = fVar5 * (ray->d).super_Tuple3<pbrt::Vector3,_float>.z +
                 (ray->o).super_Tuple3<pbrt::Point3,_float>.z;
    auVar19 = (undefined1  [60])0x0;
    local_48._0_8_ = vmovlps_avx(auVar7);
    auVar12 = (undefined1  [56])0x0;
    PVar25 = AnimatedTransform::ApplyInverse
                       ((AnimatedTransform *)this,(Point3f *)&local_48,ray->time);
    auVar16._0_4_ = PVar25.super_Tuple3<pbrt::Point3,_float>.z;
    auVar16._4_60_ = auVar19;
    auVar10._0_8_ = PVar25.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar10._8_56_ = auVar12;
    auVar6 = vmovshdup_avx(auVar10._0_16_);
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ *
                                           (this->super_ProjectiveCamera).cameraFromRaster.mInv.m[3]
                                           [1])),auVar10._0_16_,
                             ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.mInv.m[3]
                                           [0]));
    auVar7 = vfmadd213ss_fma(ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.mInv.m[3]
                                           [2]),auVar16._0_16_,
                             ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.mInv.m[3]
                                           [3]));
    va = auVar8._0_4_ + auVar7._0_4_;
    local_50 = 0;
    if ((va == 0.0) && (!NAN(va))) {
      LogFatal<char_const(&)[3],char_const(&)[2],char_const(&)[3],float&,char_const(&)[2],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/transform.h"
                 ,0x17a,"Check failed: %s != %s with %s = %s, %s = %s",(char (*) [3])"wp",
                 (char (*) [2])0x2d2665d,(char (*) [3])"wp",&va,(char (*) [2])0x2d2665d,&local_50);
    }
    auVar7 = vinsertps_avx(*(undefined1 (*) [16])
                            ((this->super_ProjectiveCamera).cameraFromRaster.mInv.m[0] + 1),
                           ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.mInv.m[1]
                                         [1]),0x10);
    auVar22._0_4_ = auVar6._0_4_ * auVar7._0_4_;
    auVar22._4_4_ = auVar6._4_4_ * auVar7._4_4_;
    auVar22._8_4_ = auVar6._8_4_ * auVar7._8_4_;
    auVar22._12_4_ = auVar6._12_4_ * auVar7._12_4_;
    auVar6 = vinsertps_avx(*(undefined1 (*) [16])
                            ((this->super_ProjectiveCamera).cameraFromRaster.mInv.m[0] + 2),
                           ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.mInv.m[1]
                                         [2]),0x10);
    auVar13._4_4_ = auVar16._0_4_;
    auVar13._0_4_ = auVar16._0_4_;
    auVar13._8_4_ = auVar16._0_4_;
    auVar13._12_4_ = auVar16._0_4_;
    auVar7 = vinsertps_avx(*(undefined1 (*) [16])
                            ((this->super_ProjectiveCamera).cameraFromRaster.mInv.m[0] + 3),
                           ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.mInv.m[1]
                                         [3]),0x10);
    auVar7 = vfmadd231ps_fma(auVar7,auVar6,auVar13);
    auVar6 = vinsertps_avx((undefined1  [16])
                           (this->super_ProjectiveCamera).cameraFromRaster.mInv.m[0],
                           ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.mInv.m[1]
                                         [0]),0x10);
    auVar8._0_4_ = PVar25.super_Tuple3<pbrt::Point3,_float>.x;
    auVar8._4_4_ = auVar8._0_4_;
    auVar8._8_4_ = auVar8._0_4_;
    auVar8._12_4_ = auVar8._0_4_;
    auVar6 = vfmadd213ps_fma(auVar8,auVar6,auVar22);
    auVar9._0_4_ = auVar6._0_4_ + auVar7._0_4_;
    auVar9._4_4_ = auVar6._4_4_ + auVar7._4_4_;
    auVar9._8_4_ = auVar6._8_4_ + auVar7._8_4_;
    auVar9._12_4_ = auVar6._12_4_ + auVar7._12_4_;
    auVar12 = ZEXT856(auVar9._8_8_);
    auVar14._4_4_ = va;
    auVar14._0_4_ = va;
    auVar14._8_4_ = va;
    auVar14._12_4_ = va;
    auVar6 = vdivps_avx(auVar9,auVar14);
    auVar17 = ZEXT1664(auVar6);
    if ((va == 1.0) && (!NAN(va))) {
      auVar17 = ZEXT1664(auVar9);
    }
    auVar20 = auVar17._8_56_;
    local_38 = auVar17._0_16_;
    BVar23 = FilmBase::SampleBounds
                       ((FilmBase *)
                        ((this->super_ProjectiveCamera).super_CameraBase.film.
                         super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits & 0xffffffffffff
                        ));
    auVar18._0_8_ = BVar23.pMax.super_Tuple2<pbrt::Point2,_float>;
    auVar18._8_56_ = auVar20;
    auVar11._0_8_ = BVar23.pMin.super_Tuple2<pbrt::Point2,_float>;
    auVar11._8_56_ = auVar12;
    auVar6 = vmovlhps_avx(local_38,auVar11._0_16_);
    auVar7 = vmovlhps_avx(auVar18._0_16_,local_38);
    uVar3 = vcmpps_avx512vl(auVar6,auVar7,2);
    if ((char)uVar3 == '\x0f') {
      fVar5 = (this->super_ProjectiveCamera).lensRadius;
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar5),ZEXT816(0) << 0x20,4);
      bVar4 = (bool)((byte)uVar3 & 1);
      *pdfPos = (Float)((uint)bVar4 * (int)(1.0 / (fVar5 * fVar5 * 3.1415927)) +
                       (uint)!bVar4 * 0x3f800000);
      *pdfDir = 1.0 / (fVar21 * fVar21 * fVar21 * this->A);
      return;
    }
  }
  *pdfDir = 0.0;
  *pdfPos = 0.0;
  return;
}

Assistant:

void PerspectiveCamera::PDF_We(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    // Return zero PDF values if ray direction is not front-facing
    Float cosTheta = Dot(ray.d, RenderFromCamera(Vector3f(0, 0, 1), ray.time));
    if (cosTheta <= cosTotalWidth) {
        *pdfPos = *pdfDir = 0;
        return;
    }

    // Map ray $(\p{}, \w{})$ onto the raster grid
    Point3f pFocus = ray((lensRadius > 0 ? focalDistance : 1) / cosTheta);
    Point3f pCamera = CameraFromRender(pFocus, ray.time);
    Point3f pRaster = cameraFromRaster.ApplyInverse(pCamera);

    // Return zero probability for out of bounds points
    Bounds2f sampleBounds = film.SampleBounds();
    if (!Inside(Point2f(pRaster.x, pRaster.y), sampleBounds)) {
        *pdfPos = *pdfDir = 0;
        return;
    }

    // Compute lens area  and return perspective camera probabilities
    Float lensArea = lensRadius != 0 ? (Pi * lensRadius * lensRadius) : 1;
    *pdfPos = 1 / lensArea;
    *pdfDir = 1 / (A * Pow<3>(cosTheta));
}